

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  undefined8 uVar1;
  ZSTD_window_t window;
  uint uVar2;
  U32 extDict_00;
  uint uVar3;
  undefined1 (*srcSize_00) [12];
  size_t sVar4;
  ZSTD_entropyCTables_t *nextEntropy;
  ZSTD_matchState_t *in_RCX;
  rawSeqStore_t *in_RDX;
  ldmState_t *in_RSI;
  long in_RDI;
  BYTE *in_R8;
  ZSTD_compressedBlockState_t *tmp;
  size_t cSize;
  BYTE *lastLiterals;
  ZSTD_blockCompressor blockCompressor;
  size_t errcod;
  rawSeqStore_t ldmSeqStore;
  int i;
  size_t lastLLSize;
  U32 extDict;
  U32 current;
  BYTE *istart;
  BYTE *base;
  ZSTD_matchState_t *ms;
  BYTE *anchor;
  U32 UVar5;
  undefined4 uVar6;
  int in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  void *in_stack_ffffffffffffff58;
  ZSTD_CCtx_params *in_stack_ffffffffffffff60;
  ZSTD_entropyCTables_t *in_stack_ffffffffffffff70;
  seqStore_t *in_stack_ffffffffffffff78;
  undefined8 local_80 [2];
  size_t in_stack_ffffffffffffff90;
  U32 *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int iVar7;
  U32 *in_stack_ffffffffffffffa8;
  rawSeqStore_t *rawSeqStore;
  BYTE *pBVar8;
  ZSTD_matchState_t *params;
  size_t local_8;
  
  srcSize_00 = (undefined1 (*) [12])(in_RDI + 0x268);
  if (in_R8 < (BYTE *)0x7) {
    ZSTD_ldm_skipSequences((rawSeqStore_t *)(in_RDI + 0x238),(size_t)in_R8,*(U32 *)(in_RDI + 0x9c));
    local_8 = 0;
  }
  else {
    ZSTD_resetSeqStore((seqStore_t *)(in_RDI + 0x1b0));
    *(undefined8 *)(srcSize_00[0xd] + 4) = *(undefined8 *)(in_RDI + 600);
    rawSeqStore = *(rawSeqStore_t **)(*srcSize_00 + 8);
    uVar2 = (int)in_RCX - (int)rawSeqStore;
    if (*(int *)srcSize_00[3] + 0x180U < uVar2) {
      if ((uVar2 - *(int *)srcSize_00[3]) - 0x180 < 0xc1) {
        in_stack_ffffffffffffff50 = (uVar2 - *(int *)srcSize_00[3]) + -0x180;
      }
      else {
        in_stack_ffffffffffffff50 = 0xc0;
      }
      *(uint *)srcSize_00[3] = uVar2 - in_stack_ffffffffffffff50;
      in_stack_ffffffffffffff54 = uVar2;
    }
    anchor = *(BYTE **)*srcSize_00;
    UVar5 = (U32)*(undefined8 *)(*srcSize_00 + 8);
    uVar6 = (undefined4)((ulong)*(undefined8 *)(*srcSize_00 + 8) >> 0x20);
    window.base._4_4_ = uVar6;
    window._0_12_ = *srcSize_00;
    window.dictBase._0_4_ = (int)*(undefined8 *)(srcSize_00[1] + 4);
    window.dictBase._4_4_ = (int)((ulong)*(undefined8 *)(srcSize_00[1] + 4) >> 0x20);
    window.dictLimit = *(U32 *)((long)(srcSize_00 + 2) + 0);
    window.lowLimit = *(U32 *)((long)(srcSize_00 + 2) + 4);
    params = in_RCX;
    extDict_00 = ZSTD_window_hasExtDict(window);
    for (iVar7 = 0; iVar7 < 3; iVar7 = iVar7 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x260) + 0x11e4 + (long)iVar7 * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 600) + 0x11e4 + (long)iVar7 * 4);
    }
    if (*(ulong *)(in_RDI + 0x240) < *(ulong *)(in_RDI + 0x248)) {
      pBVar8 = in_R8;
      sVar4 = ZSTD_ldm_blockCompress
                        (rawSeqStore,in_RCX,(seqStore_t *)CONCAT44(uVar2,extDict_00),
                         in_stack_ffffffffffffffa8,
                         (ZSTD_compressionParameters *)CONCAT44(iVar7,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98,(size_t)in_R8,(int)params);
      anchor = in_R8;
      UVar5 = extDict_00;
      in_R8 = pBVar8;
    }
    else if (*(int *)(in_RDI + 0xcc) == 0) {
      in_stack_ffffffffffffff70 =
           (ZSTD_entropyCTables_t *)
           ZSTD_selectBlockCompressor(*(ZSTD_strategy *)(in_RDI + 0xa4),extDict_00);
      sVar4 = (*(code *)in_stack_ffffffffffffff70)
                        (srcSize_00,in_RDI + 0x1b0,*(long *)(in_RDI + 0x260) + 0x11e4,in_RDI + 0x8c,
                         params,in_R8);
    }
    else {
      memset(local_80,0,0x20);
      local_80[0] = *(undefined8 *)(in_RDI + 0x228);
      in_stack_ffffffffffffff98 = *(U32 **)(in_RDI + 0x230);
      in_stack_ffffffffffffff78 =
           (seqStore_t *)
           ZSTD_ldm_generateSequences(in_RSI,in_RDX,(ldmParams_t *)params,in_R8,(size_t)srcSize_00);
      UVar5 = extDict_00;
      anchor = in_R8;
      uVar3 = ERR_isError((size_t)in_stack_ffffffffffffff78);
      if (uVar3 != 0) {
        return (size_t)in_stack_ffffffffffffff78;
      }
      in_R8 = anchor;
      sVar4 = ZSTD_ldm_blockCompress
                        (rawSeqStore,in_RCX,(seqStore_t *)CONCAT44(uVar2,UVar5),
                         in_stack_ffffffffffffffa8,
                         (ZSTD_compressionParameters *)CONCAT44(iVar7,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98,(size_t)anchor,(int)params);
    }
    nextEntropy = (ZSTD_entropyCTables_t *)(in_R8 + ((long)&params->window - sVar4));
    ZSTD_storeLastLiterals((seqStore_t *)CONCAT44(uVar6,UVar5),anchor,0x1faec4);
    local_8 = ZSTD_compressSequences
                        (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,nextEntropy,
                         in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffffa0);
    uVar2 = ZSTD_isError(0x1faf53);
    if ((uVar2 == 0) && (local_8 != 0)) {
      uVar1 = *(undefined8 *)(in_RDI + 600);
      *(undefined8 *)(in_RDI + 600) = *(undefined8 *)(in_RDI + 0x260);
      *(undefined8 *)(in_RDI + 0x260) = uVar1;
    }
  }
  return local_8;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%zu, dictLimit=%u, nextToUpdate=%u)",
                dstCapacity, ms->window.dictLimit, ms->nextToUpdate);

    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.searchLength);
        return 0;   /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;   /* required for optimal parser to read stats from dictionary */

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   U32 const extDict = ZSTD_window_hasExtDict(ms->window);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       &zc->appliedParams.cParams,
                                       src, srcSize, extDict);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            CHECK_F(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       &zc->appliedParams.cParams,
                                       src, srcSize, extDict);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, extDict);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, &zc->appliedParams.cParams, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }

    /* encode sequences and literals */
    {   size_t const cSize = ZSTD_compressSequences(&zc->seqStore,
                                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                                &zc->appliedParams,
                                dst, dstCapacity,
                                srcSize, zc->entropyWorkspace, zc->bmi2);
        if (ZSTD_isError(cSize) || cSize == 0) return cSize;
        /* confirm repcodes and entropy tables */
        {   ZSTD_compressedBlockState_t* const tmp = zc->blockState.prevCBlock;
            zc->blockState.prevCBlock = zc->blockState.nextCBlock;
            zc->blockState.nextCBlock = tmp;
        }
        return cSize;
    }
}